

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O1

EStatusCode __thiscall
PDFDocumentHandler::WritePDFStreamInputToContentContext
          (PDFDocumentHandler *this,PageContentContext *inContentContext,
          PDFStreamInput *inContentSource,StringToStringMap *inMappedResourcesNames)

{
  EStatusCode EVar1;
  Trace *pTVar2;
  PDFStream *this_00;
  IByteWriter *inTargetStream;
  char *inFormat;
  
  EVar1 = PageContentContext::StartAStreamIfRequired(inContentContext);
  if (EVar1 == eSuccess) {
    this_00 = PageContentContext::GetCurrentPageContentStream(inContentContext);
    if (this_00 == (PDFStream *)0x0) {
      pTVar2 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar2,
                        "PDFDocumentHandler::WritePDFStreamInputToContentContext, failed to get current page content stream"
                       );
      return eFailure;
    }
    inTargetStream = PDFStream::GetWriteStream(this_00);
    EVar1 = WritePDFStreamInputToStream(this,inTargetStream,inContentSource,inMappedResourcesNames);
    if (EVar1 == eSuccess) {
      EVar1 = PageContentContext::FinalizeCurrentStream(inContentContext);
      return EVar1;
    }
    pTVar2 = Trace::DefaultTrace();
    inFormat = 
    "PDFDocumentHandler::WritePDFStreamInputToContentContext, failed to write content stream from page input to target page"
    ;
  }
  else {
    pTVar2 = Trace::DefaultTrace();
    inFormat = 
    "PDFDocumentHandler::WritePDFStreamInputToContentContext, failed to start a stream in content context"
    ;
  }
  Trace::TraceToLog(pTVar2,inFormat);
  return EVar1;
}

Assistant:

EStatusCode PDFDocumentHandler::WritePDFStreamInputToContentContext(PageContentContext* inContentContext,PDFStreamInput* inContentSource,const StringToStringMap& inMappedResourcesNames)
{
	EStatusCode status = PDFHummus::eSuccess;
	
	do
	{
		status = inContentContext->StartAStreamIfRequired();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("PDFDocumentHandler::WritePDFStreamInputToContentContext, failed to start a stream in content context");
			break;
		}

		PDFStream* contentStream = inContentContext->GetCurrentPageContentStream();
		if(!contentStream)
		{
			TRACE_LOG("PDFDocumentHandler::WritePDFStreamInputToContentContext, failed to get current page content stream");
			status = PDFHummus::eFailure;
			break;
		}

		status = WritePDFStreamInputToStream(contentStream->GetWriteStream(),inContentSource,inMappedResourcesNames);
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("PDFDocumentHandler::WritePDFStreamInputToContentContext, failed to write content stream from page input to target page");
			break;
		}

		status = inContentContext->FinalizeCurrentStream(); // i want to begin a new stream after this, to maintain some sort of consistency [if important] with the embedded pages

	}while(false);

	return status;
}